

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin.c
# Opt level: O3

SchemeObject * IsGreaterThanProcedure(SchemeObject *arguments)

{
  char cVar1;
  SchemeObject *pSVar2;
  SchemeObject *pSVar3;
  SchemeObject **ppSVar4;
  
  pSVar2 = Car(arguments);
  pSVar2 = (pSVar2->data).pair.car;
  pSVar3 = Cdr(arguments);
  cVar1 = IsTheEmptyList(pSVar3);
  if (cVar1 == '\0') {
    pSVar3 = Car(pSVar3);
    ppSVar4 = &True;
    if ((long)pSVar2 < (long)(pSVar3->data).pair.car) {
      ppSVar4 = &False;
    }
  }
  else {
    ppSVar4 = &True;
  }
  return *ppSVar4;
}

Assistant:

static SchemeObject*
IsGreaterThanProcedure(SchemeObject* arguments) /* (> ...) */
{
    long previout = (Car(arguments))->data.fixnum.value;
    long next;
    while (!IsTheEmptyList(arguments = Cdr(arguments))) {
        next = (Car(arguments))->data.fixnum.value;
        if (previout < next) {
            return False;
        } else {
            return True;
        }
    }
    return True;
}